

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Serial.cpp
# Opt level: O0

int __thiscall axl::io::Serial::open(Serial *this,char *__file,int __oflag,...)

{
  uint uVar1;
  uint_t posixFlags;
  undefined4 local_24;
  undefined4 local_18;
  
  if ((__oflag & 1U) == 0) {
    local_24 = 2;
    if ((__oflag & 2U) != 0) {
      local_24 = 1;
    }
  }
  else {
    local_24 = 0;
  }
  local_18 = local_24;
  if ((__oflag & 0x100U) != 0) {
    local_18 = local_24 | 0x800;
  }
  uVar1 = psx::Serial::open(&this->m_serial,__file,local_18 | 0x100);
  return uVar1 & 0xffffff01;
}

Assistant:

bool
Serial::open(
	const sl::StringRef& name,
	uint_t flags
) {
	uint_t posixFlags =
		(flags & FileFlag_ReadOnly) ? O_RDONLY :
		(flags & FileFlag_WriteOnly) ? O_WRONLY : O_RDWR;

	if (flags & FileFlag_Asynchronous)
		posixFlags |= O_NONBLOCK;

	posixFlags |= O_NOCTTY;

	return m_serial.open(name, posixFlags);
}